

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool_test.cpp
# Opt level: O0

void __thiscall jbcoin::tests::ValidatorKeysTool_test::testCreateToken(ValidatorKeysTool_test *this)

{
  uint uVar1;
  string *__rhs;
  allocator local_3e1;
  undefined1 local_3e0 [8];
  string expectedError_3;
  undefined1 local_3b8 [8];
  string expectedError_2;
  ValidatorKeys keys;
  undefined1 local_328 [8];
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> kp;
  KeyType keyType;
  string expectedError_1;
  string expectedError;
  anon_class_8_1_8991fb9c testToken;
  path local_268;
  undefined1 local_248 [8];
  path keyFile;
  KeyFileGuard g;
  undefined1 local_1f8 [8];
  string subdir;
  CoutRedirect coutRedirect;
  stringstream coutCapture;
  allocator local_31;
  string local_30;
  ValidatorKeysTool_test *local_10;
  ValidatorKeysTool_test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Create Token",&local_31);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,&local_30,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::stringstream::stringstream((stringstream *)&coutRedirect);
  CoutRedirect::CoutRedirect
            ((CoutRedirect *)((long)&subdir.field_2 + 8),(stringstream *)&coutRedirect);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1f8,"test_key_file",(allocator *)((long)&g.test_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&g.test_ + 7));
  KeyFileGuard::KeyFileGuard
            ((KeyFileGuard *)((long)&keyFile.m_pathname.field_2 + 8),&this->super_suite,
             (string *)local_1f8);
  boost::filesystem::path::path(&local_268,(string_type *)local_1f8);
  boost::filesystem::path::path((path *)&testToken,"validator_keys.json");
  boost::filesystem::operator/((path *)local_248,&local_268,(path *)&testToken);
  boost::filesystem::path::~path((path *)&testToken);
  boost::filesystem::path::~path(&local_268);
  expectedError.field_2._8_8_ = this;
  __rhs = boost::filesystem::path::string_abi_cxx11_((path *)local_248);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expectedError_1.field_2 + 8),"Failed to open key file: ",__rhs);
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)((long)&expectedError.field_2 + 8),(path *)local_248,
             (string *)((long)&expectedError_1.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedError_1.field_2._M_local_buf + 8));
  createKeyFile((path *)local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&keyType,"",(allocator *)(kp.second.buf_ + 0x1f));
  std::allocator<char>::~allocator((allocator<char> *)(kp.second.buf_ + 0x1f));
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)((long)&expectedError.field_2 + 8),(path *)local_248,
             (string *)&keyType);
  std::__cxx11::string::~string((string *)&keyType);
  kp.second.buf_[0x18] = '\x01';
  kp.second.buf_[0x19] = '\0';
  kp.second.buf_[0x1a] = '\0';
  kp.second.buf_[0x1b] = '\0';
  randomSeed();
  generateKeyPair((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)local_328,ed25519,
                  (Seed *)&keys.tokenSequence_);
  Seed::~Seed((Seed *)&keys.tokenSequence_);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  ValidatorKeys::ValidatorKeys
            ((ValidatorKeys *)((long)&expectedError_2.field_2 + 8),
             (KeyType *)(kp.second.buf_ + 0x18),(SecretKey *)(kp.first.buf_ + 0x20),uVar1 - 1,false)
  ;
  ValidatorKeys::writeToFile
            ((ValidatorKeys *)((long)&expectedError_2.field_2 + 8),(path *)local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_3b8,
             "Maximum number of tokens have already been generated.\nRevoke validator keys if previous token has been compromised."
             ,(allocator *)(expectedError_3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expectedError_3.field_2._M_local_buf + 0xf));
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)((long)&expectedError.field_2 + 8),(path *)local_248,
             (string *)local_3b8);
  std::__cxx11::string::~string((string *)local_3b8);
  ValidatorKeys::~ValidatorKeys((ValidatorKeys *)((long)&expectedError_2.field_2 + 8));
  std::pair<jbcoin::PublicKey,_jbcoin::SecretKey>::~pair
            ((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)local_328);
  createRevocation((path *)local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_3e0,"Validator keys have been revoked.",&local_3e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)((long)&expectedError.field_2 + 8),(path *)local_248,
             (string *)local_3e0);
  std::__cxx11::string::~string((string *)local_3e0);
  boost::filesystem::path::~path((path *)local_248);
  KeyFileGuard::~KeyFileGuard((KeyFileGuard *)((long)&keyFile.m_pathname.field_2 + 8));
  std::__cxx11::string::~string((string *)local_1f8);
  CoutRedirect::~CoutRedirect((CoutRedirect *)((long)&subdir.field_2 + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)&coutRedirect);
  return;
}

Assistant:

void
    testCreateToken ()
    {
        testcase ("Create Token");

        std::stringstream coutCapture;
        CoutRedirect coutRedirect {coutCapture};

        using namespace boost::filesystem;

        std::string const subdir = "test_key_file";
        KeyFileGuard const g (*this, subdir);
        path const keyFile = subdir / "validator_keys.json";

        auto testToken = [this](
            path const& keyFile,
            std::string const& expectedError)
        {
            try
            {
                createToken (keyFile);
                BEAST_EXPECT(expectedError.empty());
            }
            catch (std::exception const& e)
            {
                BEAST_EXPECT(e.what() == expectedError);
            }
        };

        {
            std::string const expectedError =
                "Failed to open key file: " + keyFile.string();
            testToken (keyFile, expectedError);
        }

        createKeyFile (keyFile);

        {
            std::string const expectedError = "";
            testToken (keyFile, expectedError);
        }
        {
            auto const keyType = KeyType::ed25519;
            auto const kp = generateKeyPair (keyType, randomSeed ());

            auto keys = ValidatorKeys (
                keyType,
                kp.second,
                std::numeric_limits<std::uint32_t>::max () - 1);

            keys.writeToFile (keyFile);
            std::string const expectedError =
                "Maximum number of tokens have already been generated.\n"
                "Revoke validator keys if previous token has been compromised.";
            testToken (keyFile, expectedError);
        }
        {
            createRevocation (keyFile);
            std::string const expectedError =
                "Validator keys have been revoked.";
            testToken (keyFile, expectedError);
        }
    }